

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<false> * __thiscall
LabelObjectState<false>::StartObject(LabelObjectState<false> *this,Context<false> *ctx)

{
  stringstream *psVar1;
  
  (*(ctx->all->p->lp).default_label)(&ctx->ex->l);
  if ((LabelObjectState<false> *)ctx->previous_state == this) {
    psVar1 = Context<false>::error_abi_cxx11_(ctx);
    std::operator<<((ostream *)(psVar1 + 0x10),"invalid label object. nested objected.");
    this = (LabelObjectState<false> *)0x0;
  }
  else {
    this->return_state = ctx->previous_state;
  }
  return &this->super_BaseState<false>;
}

Assistant:

BaseState<audit>* StartObject(Context<audit>& ctx)
  {
    ctx.all->p->lp.default_label(&ctx.ex->l);

    // don't allow { { { } } }
    if (ctx.previous_state == this)
    {
      ctx.error() << "invalid label object. nested objected.";
      return nullptr;
    }

    // keep previous state
    return_state = ctx.previous_state;

    return this;
  }